

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void BeginEmitBlock(ParseNodeBlock *pnodeBlock,ByteCodeGenerator *byteCodeGenerator,
                   FuncInfo *funcInfo)

{
  OpCode OVar1;
  Scope *innerScope;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  RegSlot RVar5;
  undefined4 *puVar6;
  DebuggerScope *debuggerScope;
  ParseNodeBlock *pPVar7;
  ParseNodeCatch *pPVar8;
  ParseNodeFnc *pPVar9;
  ParseNodeWith *pPVar10;
  ParseNodePtr *ppPVar11;
  FuncInfo *funcInfo_00;
  DiagExtraScopesType scopeType;
  ParseNodePtr this;
  RegSlot local_44;
  DebuggerScope *pDStack_40;
  int scopeIndex;
  RegSlot local_38;
  char local_31;
  
  bVar3 = BlockHasOwnScope(pnodeBlock,byteCodeGenerator);
  innerScope = pnodeBlock->scope;
  if (bVar3) {
    ByteCodeGenerator::PushScope(byteCodeGenerator,innerScope);
    if ((innerScope->field_0x44 & 0x10) == 0) {
      funcInfo_00 = (FuncInfo *)0xffffffff;
      pDStack_40 = ByteCodeGenerator::RecordStartScopeObject
                             (byteCodeGenerator,(ParseNode *)pnodeBlock,DiagBlockScopeDirect,
                              0xffffffff,(int *)0x0);
    }
    else {
      if (innerScope->location != 0xffffffff) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x2ff,"(scopeLocation == Js::Constants::NoRegister)",
                           "scopeLocation == Js::Constants::NoRegister");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      RVar5 = FuncInfo::FirstInnerScopeReg(funcInfo);
      uVar4 = RVar5 + innerScope->innerScopeIndex;
      if ((innerScope->field_0x44 & 2) == 0) {
        local_44 = 0xffffffff;
        pDStack_40 = ByteCodeGenerator::RecordStartScopeObject
                               (byteCodeGenerator,(ParseNode *)pnodeBlock,DiagBlockScopeInSlot,uVar4
                                ,(int *)&local_44);
        uVar4 = innerScope->scopeSlotCount + 2;
        funcInfo_00 = (FuncInfo *)(ulong)uVar4;
        Js::ByteCodeWriter::Num3
                  (&byteCodeGenerator->m_writer,NewInnerScopeSlots,innerScope->innerScopeIndex,uVar4
                   ,local_44);
      }
      else {
        funcInfo_00 = (FuncInfo *)(ulong)uVar4;
        pDStack_40 = ByteCodeGenerator::RecordStartScopeObject
                               (byteCodeGenerator,(ParseNode *)pnodeBlock,DiagBlockScopeInObject,
                                uVar4,(int *)0x0);
        Js::ByteCodeWriter::Unsigned1
                  (&byteCodeGenerator->m_writer,NewBlockScope,innerScope->innerScopeIndex);
      }
    }
    local_31 = Scope::IsGlobalEvalBlockScope(innerScope);
    this = pnodeBlock->pnodeScopes;
    if (this == (ParseNodePtr)0x0) {
      local_38 = 0xffffffff;
    }
    else {
      local_38 = 0xffffffff;
      RVar5 = 0xffffffff;
      do {
        OVar1 = this->nop;
        if (OVar1 < knopWith) {
          if (OVar1 == knopFncDecl) {
            pPVar9 = ParseNode::AsParseNodeFnc(this);
            if ((pPVar9->fncFlags & kFunctionDeclaration) != kFunctionNone) {
              if (RVar5 == 0xffffffff) {
                RVar5 = funcInfo->frameDisplayRegister;
                if (RVar5 == 0xffffffff) {
                  RVar5 = FuncInfo::GetEnvRegister(funcInfo);
                }
                local_38 = FuncInfo::AcquireTmpRegister(funcInfo);
                RVar5 = ByteCodeGenerator::PrependLocalScopes
                                  (byteCodeGenerator,RVar5,local_38,funcInfo);
              }
              pPVar9 = ParseNode::AsParseNodeFnc(this);
              funcInfo_00 = (FuncInfo *)&DAT_00000001;
              ByteCodeGenerator::DefineOneFunction
                        (byteCodeGenerator,pPVar9,funcInfo,true,RVar5,0xffffffff);
            }
            if (local_31 != '\0') {
              FuncInfo::ReleaseLoc(funcInfo,this);
              this->location = 0xffffffff;
            }
            pPVar9 = ParseNode::AsParseNodeFnc(this);
            ppPVar11 = &pPVar9->pnodeNext;
            goto LAB_0080862e;
          }
          if (OVar1 == knopBlock) {
            pPVar7 = ParseNode::AsParseNodeBlock(this);
            ppPVar11 = &pPVar7->pnodeNext;
            goto LAB_0080862e;
          }
        }
        else {
          if (OVar1 == knopWith) {
            pPVar10 = ParseNode::AsParseNodeWith(this);
            ppPVar11 = &pPVar10->pnodeNext;
          }
          else {
            if (OVar1 != knopCatch) goto LAB_00808631;
            pPVar8 = ParseNode::AsParseNodeCatch(this);
            ppPVar11 = &pPVar8->pnodeNext;
          }
LAB_0080862e:
          this = *ppPVar11;
        }
LAB_00808631:
      } while (this != (ParseNodePtr)0x0);
    }
    debuggerScope = pDStack_40;
    if (local_38 != 0xffffffff) {
      FuncInfo::ReleaseTmpRegister(funcInfo,local_38);
      debuggerScope = pDStack_40;
    }
  }
  else {
    if (innerScope == (Scope *)0x0) {
      scopeType = DiagBlockScopeInSlot;
    }
    else if ((innerScope->field_0x44 & 0x10) == 0) {
      scopeType = DiagBlockScopeDirect;
    }
    else {
      scopeType = DiagBlockScopeInObject;
    }
    funcInfo_00 = (FuncInfo *)0xffffffff;
    debuggerScope =
         ByteCodeGenerator::RecordStartScopeObject
                   (byteCodeGenerator,(ParseNode *)pnodeBlock,scopeType,0xffffffff,(int *)0x0);
  }
  ByteCodeGenerator::InitBlockScopedContent(byteCodeGenerator,pnodeBlock,debuggerScope,funcInfo_00);
  return;
}

Assistant:

void BeginEmitBlock(ParseNodeBlock *pnodeBlock, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    Js::DebuggerScope* debuggerScope = nullptr;

    if (BlockHasOwnScope(pnodeBlock, byteCodeGenerator))
    {
        Scope *scope = pnodeBlock->scope;
        byteCodeGenerator->PushScope(scope);

        Js::RegSlot scopeLocation = scope->GetLocation();
        if (scope->GetMustInstantiate())
        {
            Assert(scopeLocation == Js::Constants::NoRegister);
            scopeLocation = funcInfo->FirstInnerScopeReg() + scope->GetInnerScopeIndex();

            if (scope->GetIsObject())
            {
                debuggerScope = byteCodeGenerator->RecordStartScopeObject(pnodeBlock, Js::DiagExtraScopesType::DiagBlockScopeInObject, scopeLocation);

                byteCodeGenerator->Writer()->Unsigned1(Js::OpCode::NewBlockScope, scope->GetInnerScopeIndex());
            }
            else
            {
                int scopeIndex = Js::DebuggerScope::InvalidScopeIndex;
                debuggerScope = byteCodeGenerator->RecordStartScopeObject(pnodeBlock, Js::DiagExtraScopesType::DiagBlockScopeInSlot, scopeLocation, &scopeIndex);

                // TODO: Handle heap enumeration
                int scopeSlotCount = scope->GetScopeSlotCount();
                byteCodeGenerator->Writer()->Num3(Js::OpCode::NewInnerScopeSlots, scope->GetInnerScopeIndex(), scopeSlotCount + Js::ScopeSlots::FirstSlotIndex, scopeIndex);
            }
        }
        else
        {
            // In the direct register access case, there is no block scope emitted but we can still track
            // the start and end offset of the block.  The location registers for let/const variables will still be
            // captured along with this range in InitBlockScopedContent().
            debuggerScope = byteCodeGenerator->RecordStartScopeObject(pnodeBlock, Js::DiagExtraScopesType::DiagBlockScopeDirect);
        }

        bool const isGlobalEvalBlockScope = scope->IsGlobalEvalBlockScope();
        Js::RegSlot frameDisplayLoc = Js::Constants::NoRegister;
        Js::RegSlot tmpInnerEnvReg = Js::Constants::NoRegister;
        ParseNodePtr pnodeScope;
        for (pnodeScope = pnodeBlock->pnodeScopes; pnodeScope;)
        {
            switch (pnodeScope->nop)
            {
            case knopFncDecl:
                if (pnodeScope->AsParseNodeFnc()->IsDeclaration())
                {
                    // The frameDisplayLoc register's lifetime has to be controlled by this function. We can't let
                    // it be released by DefineOneFunction, because further iterations of this loop can allocate
                    // temps, and we can't let frameDisplayLoc be re-purposed until this loop completes.
                    // So we'll supply a temp that we allocate and release here.
                    if (frameDisplayLoc == Js::Constants::NoRegister)
                    {
                        if (funcInfo->frameDisplayRegister != Js::Constants::NoRegister)
                        {
                            frameDisplayLoc = funcInfo->frameDisplayRegister;
                        }
                        else
                        {
                            frameDisplayLoc = funcInfo->GetEnvRegister();
                        }
                        tmpInnerEnvReg = funcInfo->AcquireTmpRegister();
                        frameDisplayLoc = byteCodeGenerator->PrependLocalScopes(frameDisplayLoc, tmpInnerEnvReg, funcInfo);
                    }
                    byteCodeGenerator->DefineOneFunction(pnodeScope->AsParseNodeFnc(), funcInfo, true, frameDisplayLoc);
                }

                // If this is the global eval block scope, the function is actually assigned to the global
                // so we don't need to keep the registers.
                if (isGlobalEvalBlockScope)
                {
                    funcInfo->ReleaseLoc(pnodeScope);
                    pnodeScope->location = Js::Constants::NoRegister;
                }
                pnodeScope = pnodeScope->AsParseNodeFnc()->pnodeNext;
                break;

            case knopBlock:
                pnodeScope = pnodeScope->AsParseNodeBlock()->pnodeNext;
                break;

            case knopCatch:
                pnodeScope = pnodeScope->AsParseNodeCatch()->pnodeNext;
                break;

            case knopWith:
                pnodeScope = pnodeScope->AsParseNodeWith()->pnodeNext;
                break;
            }
        }

        if (tmpInnerEnvReg != Js::Constants::NoRegister)
        {
            funcInfo->ReleaseTmpRegister(tmpInnerEnvReg);
        }
    }
    else
    {
        Scope *scope = pnodeBlock->scope;
        if (scope)
        {
            if (scope->GetMustInstantiate())
            {
                debuggerScope = byteCodeGenerator->RecordStartScopeObject(pnodeBlock, Js::DiagExtraScopesType::DiagBlockScopeInObject);
            }
            else
            {
                debuggerScope = byteCodeGenerator->RecordStartScopeObject(pnodeBlock, Js::DiagExtraScopesType::DiagBlockScopeDirect);
            }
        }
        else
        {
            debuggerScope = byteCodeGenerator->RecordStartScopeObject(pnodeBlock, Js::DiagExtraScopesType::DiagBlockScopeInSlot);
        }
    }

    byteCodeGenerator->InitBlockScopedContent(pnodeBlock, debuggerScope, funcInfo);
}